

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O0

index_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::claimCapacity
          (ManyToOneRingBuffer *this,index_t requiredCapacity)

{
  AtomicBuffer *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  uint uVar5;
  int32_t headIndex;
  index_t toBufferEndLength;
  index_t availableCapacity;
  index_t padding;
  index_t tailIndex;
  int64_t tail;
  int64_t head;
  index_t mask;
  index_t requiredCapacity_local;
  ManyToOneRingBuffer *this_local;
  
  uVar5 = this->m_capacity - 1;
  tail = AtomicBuffer::getInt64Volatile(this->m_buffer,this->m_headCachePositionIndex);
  do {
    iVar4 = AtomicBuffer::getInt64Volatile(this->m_buffer,this->m_tailPositionIndex);
    uVar1 = (uint)iVar4;
    if ((int)(this->m_capacity - (uVar1 - (int)tail)) < requiredCapacity) {
      tail = AtomicBuffer::getInt64Volatile(this->m_buffer,this->m_headPositionIndex);
      if ((int)(this->m_capacity - (uVar1 - (int)tail)) < requiredCapacity) {
        return -2;
      }
      AtomicBuffer::putInt64Ordered(this->m_buffer,this->m_headCachePositionIndex,tail);
    }
    toBufferEndLength = 0;
    availableCapacity = uVar1 & uVar5;
    iVar3 = this->m_capacity - availableCapacity;
    if ((iVar3 < requiredCapacity) &&
       (toBufferEndLength = iVar3, (int)((uint)tail & uVar5) < requiredCapacity)) {
      tail = AtomicBuffer::getInt64Volatile(this->m_buffer,this->m_headPositionIndex);
      if ((int)((uint)tail & uVar5) < requiredCapacity) {
        return -2;
      }
      AtomicBuffer::putInt64Ordered(this->m_buffer,this->m_headCachePositionIndex,tail);
    }
    bVar2 = AtomicBuffer::compareAndSetInt64
                      (this->m_buffer,this->m_tailPositionIndex,iVar4,
                       iVar4 + requiredCapacity + (long)toBufferEndLength);
  } while (((bVar2 ^ 0xffU) & 1) != 0);
  if (toBufferEndLength != 0) {
    this_00 = this->m_buffer;
    iVar4 = RecordDescriptor::makeHeader(toBufferEndLength,-1);
    AtomicBuffer::putInt64Ordered(this_00,availableCapacity,iVar4);
    availableCapacity = 0;
  }
  return availableCapacity;
}

Assistant:

util::index_t claimCapacity(util::index_t requiredCapacity)
    {
        const util::index_t mask = m_capacity - 1;
        std::int64_t head = m_buffer.getInt64Volatile(m_headCachePositionIndex);

        std::int64_t tail;
        util::index_t tailIndex;
        util::index_t padding;
        do
        {
            tail = m_buffer.getInt64Volatile(m_tailPositionIndex);
            const util::index_t availableCapacity = m_capacity - static_cast<util::index_t>(tail - head);

            if (requiredCapacity > availableCapacity)
            {
                head = m_buffer.getInt64Volatile(m_headPositionIndex);

                if (requiredCapacity > (m_capacity - static_cast<util::index_t>(tail - head)))
                {
                    return INSUFFICIENT_CAPACITY;
                }

                m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
            }

            padding = 0;
            tailIndex = static_cast<util::index_t>(tail & mask);
            const util::index_t toBufferEndLength = m_capacity - tailIndex;

            if (requiredCapacity > toBufferEndLength)
            {
                std::int32_t headIndex = static_cast<std::int32_t>(head & mask);

                if (requiredCapacity > headIndex)
                {
                    head = m_buffer.getInt64Volatile(m_headPositionIndex);
                    headIndex = static_cast<std::int32_t>(head & mask);

                    if (requiredCapacity > headIndex)
                    {
                        return INSUFFICIENT_CAPACITY;
                    }

                    m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
                }

                padding = toBufferEndLength;
            }
        }
        while (!m_buffer.compareAndSetInt64(m_tailPositionIndex, tail, tail + requiredCapacity + padding));

        if (0 != padding)
        {
            m_buffer.putInt64Ordered(
                tailIndex, RecordDescriptor::makeHeader(padding, RecordDescriptor::PADDING_MSG_TYPE_ID));
            tailIndex = 0;
        }

        return tailIndex;
    }